

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

void sect_RelWord(Expression *expr,uint32_t pcShift)

{
  bool bVar1;
  uint32_t pcShift_local;
  Expression *expr_local;
  
  bVar1 = checkcodesection();
  if ((bVar1) && (bVar1 = reserveSpace(2), bVar1)) {
    bVar1 = rpn_isKnown(expr);
    if (bVar1) {
      writeword((uint16_t)expr->val);
    }
    else {
      createPatch(PATCHTYPE_WORD,expr,pcShift);
      writeword(0);
    }
    rpn_Free(expr);
  }
  return;
}

Assistant:

void sect_RelWord(struct Expression *expr, uint32_t pcShift)
{
	if (!checkcodesection())
		return;
	if (!reserveSpace(2))
		return;

	if (!rpn_isKnown(expr)) {
		createPatch(PATCHTYPE_WORD, expr, pcShift);
		writeword(0);
	} else {
		writeword(expr->val);
	}
	rpn_Free(expr);
}